

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O2

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseANDOperator,bool,false,false>
               (hugeint_t *ldata,hugeint_t *rdata,hugeint_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  ulong uVar1;
  unsigned_long *puVar2;
  hugeint_t right;
  hugeint_t right_00;
  hugeint_t left;
  hugeint_t left_00;
  hugeint_t left_01;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  hugeint_t hVar12;
  uint64_t in_stack_ffffffffffffff98;
  int64_t in_stack_ffffffffffffffa0;
  int64_t in_stack_ffffffffffffffb0;
  idx_t iVar13;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    lVar6 = 8;
    while (bVar11 = count != 0, count = count - 1, bVar11) {
      left_01.upper = in_stack_ffffffffffffffb0;
      left_01.lower = (uint64_t)result_data;
      hVar12.upper = in_stack_ffffffffffffffa0;
      hVar12.lower = in_stack_ffffffffffffff98;
      hVar12 = BitwiseANDOperator::Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                         (left_01,hVar12);
      *(uint64_t *)((long)result_data + lVar6 + -8) = hVar12.lower;
      *(int64_t *)((long)&result_data->lower + lVar6) = hVar12.upper;
      lVar6 = lVar6 + 0x10;
    }
  }
  else {
    uVar1 = count + 0x3f;
    uVar5 = 0;
    iVar13 = count;
    for (uVar4 = 0; uVar4 != uVar1 >> 6; uVar4 = uVar4 + 1) {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar8 = uVar5 + 0x40;
        if (count <= uVar5 + 0x40) {
          uVar8 = count;
        }
LAB_01e66d94:
        uVar9 = uVar5 << 4 | 8;
        for (; uVar3 = uVar5, uVar5 < uVar8; uVar5 = uVar5 + 1) {
          left.upper = iVar13;
          left.lower = (uint64_t)result_data;
          right.upper = uVar4;
          right.lower = in_stack_ffffffffffffff98;
          hVar12 = BitwiseANDOperator::
                   Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>(left,right);
          *(uint64_t *)((long)result_data + (uVar9 - 8)) = hVar12.lower;
          *(int64_t *)((long)&result_data->lower + uVar9) = hVar12.upper;
          uVar9 = uVar9 + 0x10;
        }
      }
      else {
        uVar9 = puVar2[uVar4];
        uVar8 = uVar5 + 0x40;
        if (count <= uVar5 + 0x40) {
          uVar8 = count;
        }
        if (uVar9 == 0xffffffffffffffff) goto LAB_01e66d94;
        uVar3 = uVar8;
        if (uVar9 != 0) {
          uVar7 = uVar5 << 4 | 8;
          count = iVar13;
          for (uVar10 = 0; uVar3 = uVar5 + uVar10, iVar13 = count, uVar5 + uVar10 < uVar8;
              uVar10 = uVar10 + 1) {
            if ((uVar9 >> (uVar10 & 0x3f) & 1) != 0) {
              left_00.upper = count;
              left_00.lower = (uint64_t)result_data;
              right_00.upper = uVar4;
              right_00.lower = in_stack_ffffffffffffff98;
              hVar12 = BitwiseANDOperator::
                       Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                                 (left_00,right_00);
              *(uint64_t *)((long)result_data + (uVar7 - 8)) = hVar12.lower;
              *(int64_t *)((long)&result_data->lower + uVar7) = hVar12.upper;
            }
            uVar7 = uVar7 + 0x10;
          }
        }
      }
      uVar5 = uVar3;
    }
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}